

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionScale(Quaternion q,float mul)

{
  Quaternion QVar1;
  float qaw;
  float qaz;
  float qay;
  float qax;
  float mul_local;
  Quaternion q_local;
  Quaternion result;
  
  qax = q.x;
  mul_local = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  QVar1.y = (q_local.x * mul + mul_local * mul + q_local.y * mul) - qax * mul;
  QVar1.x = (mul_local * mul + qax * mul + q_local.y * mul) - q_local.x * mul;
  QVar1.z = (qax * mul + q_local.x * mul + q_local.y * mul) - mul_local * mul;
  QVar1.w = ((q_local.y * mul - qax * mul) - mul_local * mul) - q_local.x * mul;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionScale(Quaternion q, float mul)
{
    Quaternion result = { 0 };

    float qax = q.x, qay = q.y, qaz = q.z, qaw = q.w;

    result.x = qax*mul + qaw*mul + qay*mul - qaz*mul;
    result.y = qay*mul + qaw*mul + qaz*mul - qax*mul;
    result.z = qaz*mul + qaw*mul + qax*mul - qay*mul;
    result.w = qaw*mul - qax*mul - qay*mul - qaz*mul;

    return result;
}